

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Local::Bind::Bind
          (Bind *this,Fodder *var_fodder,Identifier *var,Fodder *op_fodder,AST *body,
          bool function_sugar,Fodder *paren_left_fodder,ArgParams *params,bool trailing_comma,
          Fodder *paren_right_fodder,Fodder *close_fodder)

{
  byte bVar1;
  byte bVar2;
  undefined8 in_RDX;
  long in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  byte in_stack_00000018;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
  *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  
  bVar2 = in_R9B & 1;
  bVar1 = in_stack_00000018 & 1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)(CONCAT17(in_R9B,CONCAT16(in_stack_00000018,in_stack_ffffffffffffffd0)) &
            0x101ffffffffffff),
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x18) = in_RDX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x38) = in_R8;
  *(byte *)(in_RDI + 0x40) = bVar2 & 1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_stack_ffffffffffffffc8);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
             CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),in_stack_ffffffffffffffc8);
  *(byte *)(in_RDI + 0x78) = bVar1 & 1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_stack_ffffffffffffffc8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

Bind(const Fodder &var_fodder, const Identifier *var, const Fodder &op_fodder, AST *body,
             bool function_sugar, const Fodder &paren_left_fodder, const ArgParams &params,
             bool trailing_comma, const Fodder &paren_right_fodder, const Fodder &close_fodder)
            : varFodder(var_fodder),
              var(var),
              opFodder(op_fodder),
              body(body),
              functionSugar(function_sugar),
              parenLeftFodder(paren_left_fodder),
              params(params),
              trailingComma(trailing_comma),
              parenRightFodder(paren_right_fodder),
              closeFodder(close_fodder)
        {
        }